

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_BitwiseAnd(BitwiseAndForm2 BitwiseAnd)

{
  byte bVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  code *in_RDI;
  Image *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined8 in_stack_ffffffffffffff60;
  undefined2 uVar5;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_00;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             (uint8_t)((ushort)uVar5 >> 8),(uint8_t)uVar5);
  Test_Helper::uniformImages(in_stack_00000008,unaff_retaddr);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cdf2d);
  this_00 = &local_38;
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,0);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,1);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this_00,2);
  (*local_8)(pvVar2,pvVar3,pvVar4);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_38,2);
  this = &local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,1);
  bVar1 = Unit_Test::verifyImage(pvVar2,(uint8_t)((ulong)this >> 0x38));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_BitwiseAnd(BitwiseAndForm2 BitwiseAnd)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image = uniformImages( intensity );

        BitwiseAnd( image[0], image[1], image[2] );

        return verifyImage( image[2], intensity[0] & intensity[1] );
    }